

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void corruptSchema(InitData *pData,char *zObj,char *zExtra)

{
  sqlite3 *db;
  char *pcVar1;
  undefined8 uVar2;
  int iVar3;
  
  db = pData->db;
  iVar3 = 7;
  if (db->mallocFailed == '\0') {
    if (*pData->pzErrMsg != (char *)0x0) {
      return;
    }
    if ((pData->mInitFlags & 1) == 0) {
      if ((db->flags & 1) == 0) {
        pcVar1 = "?";
        if (zObj != (char *)0x0) {
          pcVar1 = zObj;
        }
        pcVar1 = sqlite3MPrintf(db,"malformed database schema (%s)",pcVar1);
        if ((zExtra != (char *)0x0) && (*zExtra != '\0')) {
          pcVar1 = sqlite3MPrintf(db,"%z - %s",pcVar1,zExtra);
        }
        *pData->pzErrMsg = pcVar1;
        uVar2 = 0x1e354;
      }
      else {
        uVar2 = 0x1e34d;
      }
      iVar3 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar2,
                  "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
    }
    else {
      pcVar1 = sqlite3DbStrDup(db,zExtra);
      *pData->pzErrMsg = pcVar1;
      iVar3 = 1;
    }
  }
  pData->rc = iVar3;
  return;
}

Assistant:

static void corruptSchema(
  InitData *pData,     /* Initialization context */
  const char *zObj,    /* Object being parsed at the point of error */
  const char *zExtra   /* Error information */
){
  sqlite3 *db = pData->db;
  if( db->mallocFailed ){
    pData->rc = SQLITE_NOMEM_BKPT;
  }else if( pData->pzErrMsg[0]!=0 ){
    /* A error message has already been generated.  Do not overwrite it */
  }else if( pData->mInitFlags & INITFLAG_AlterTable ){
    *pData->pzErrMsg = sqlite3DbStrDup(db, zExtra);
    pData->rc = SQLITE_ERROR;
  }else if( db->flags & SQLITE_WriteSchema ){
    pData->rc = SQLITE_CORRUPT_BKPT;
  }else{
    char *z;
    if( zObj==0 ) zObj = "?";
    z = sqlite3MPrintf(db, "malformed database schema (%s)", zObj);
    if( zExtra && zExtra[0] ) z = sqlite3MPrintf(db, "%z - %s", z, zExtra);
    *pData->pzErrMsg = z;
    pData->rc = SQLITE_CORRUPT_BKPT;
  }
}